

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O2

void optimization::loop_unrolling::expand_loop(MirFunction *func,BasicBlk *blk,loop_info *info)

{
  LabelId *__k;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *this;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *this_00;
  optional<mir::inst::VarId> *this_01;
  LabelId LVar1;
  LabelId LVar2;
  pointer puVar3;
  tuple<mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> tVar4;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *puVar5;
  undefined8 uVar6;
  BasicBlk *pBVar7;
  _Alloc_hider _Var8;
  undefined8 this_02;
  int iVar9;
  _Self __tmp_2;
  mapped_type *pmVar10;
  ostream *poVar11;
  Tag *pTVar12;
  long lVar13;
  mapped_type *pmVar14;
  _Rb_tree_node_base *p_Var15;
  mapped_type *pmVar16;
  undefined4 extraout_var;
  VarId *pVVar17;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  __position;
  pointer *__ptr;
  _Self __tmp_1;
  pointer puVar18;
  Rewriter *pRVar19;
  Tag *pTVar20;
  Function *pFVar21;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var22;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<mir::inst::VarId> __l_02;
  undefined1 local_358 [8];
  undefined1 local_350 [16];
  int extra_loop_start;
  allocator_type local_339;
  BasicBlk *local_338;
  VarId cond;
  int extra_loop;
  _Alloc_hider local_308;
  mapped_type *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  VarId new_change_var;
  VarId new_phi;
  undefined1 local_2a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  LabelId local_280;
  int local_27c;
  _Rb_tree_color local_278;
  VarId *local_210;
  pair<mir::inst::Op,_mir::inst::VarId> *local_208;
  VarId *local_200;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  insts;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1e0;
  _Alloc_hider local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  pointer local_1b0;
  pointer puStack_1a8;
  undefined **local_1a0;
  JumpInstructionKind local_198;
  bool local_180;
  undefined8 local_178;
  JumpKind local_170;
  Rewriter rwt;
  VarId local_d0;
  VarId local_c0;
  undefined1 local_b0 [16];
  uint32_t local_a0;
  undefined1 local_98;
  undefined2 local_97;
  undefined1 local_90 [16];
  uint32_t local_80;
  undefined1 local_78;
  undefined2 local_77;
  Value local_70;
  undefined1 local_50 [16];
  uint32_t local_40;
  undefined1 local_38;
  undefined2 local_37;
  
  local_2f8._8_8_ = &func->basic_blks;
  __k = &info->loop_start;
  pTVar20 = (Tag *)__k;
  local_338 = blk;
  pmVar10 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)local_2f8._8_8_,__k);
  new_phi.super_Displayable._vptr_Displayable =
       new_phi.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)&new_phi,(Severity *)pTVar20);
  AixLog::Tag::Tag((Tag *)&insts);
  AixLog::operator<<((ostream *)&insts,pTVar20);
  new_change_var._8_8_ = std::chrono::_V2::system_clock::now();
  new_change_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001d8f28;
  AixLog::operator<<((ostream *)&new_change_var,(Timestamp *)pTVar20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rwt,"expand_loop",(allocator<char> *)local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cond,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
             ,(allocator<char> *)local_350);
  pRVar19 = &rwt;
  AixLog::Function::Function((Function *)local_2a8,(string *)pRVar19,(string *)&cond,0x13e);
  AixLog::operator<<((ostream *)local_2a8,(Function *)pRVar19);
  poVar11 = std::operator<<((ostream *)&std::clog,"unroll loop starts at  ");
  pTVar20 = (Tag *)(ulong)(uint)*__k;
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,*__k);
  std::endl<char,std::char_traits<char>>(poVar11);
  AixLog::Function::~Function((Function *)local_2a8);
  std::__cxx11::string::~string((string *)&cond);
  std::__cxx11::string::~string((string *)&rwt);
  AixLog::Tag::~Tag((Tag *)&insts);
  new_phi.super_Displayable._vptr_Displayable =
       new_phi.super_Displayable._vptr_Displayable & 0xffffffffffffff00;
  AixLog::operator<<((ostream *)&new_phi,(Severity *)pTVar20);
  AixLog::Tag::Tag((Tag *)&insts);
  AixLog::operator<<((ostream *)&insts,pTVar20);
  new_change_var._8_8_ = std::chrono::_V2::system_clock::now();
  new_change_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001d8f28;
  AixLog::operator<<((ostream *)&new_change_var,(Timestamp *)pTVar20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rwt,"expand_loop",(allocator<char> *)local_358);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cond,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
             ,(allocator<char> *)local_350);
  pRVar19 = &rwt;
  AixLog::Function::Function((Function *)local_2a8,(string *)pRVar19,(string *)&cond,0x13f);
  AixLog::operator<<((ostream *)local_2a8,(Function *)pRVar19);
  pTVar12 = (Tag *)std::operator<<((ostream *)&std::clog,"init_val: ");
  local_200 = &info->init_var;
  pTVar20 = pTVar12;
  (**(info->init_var).super_Displayable._vptr_Displayable)();
  std::endl<char,std::char_traits<char>>((ostream *)pTVar12);
  AixLog::Function::~Function((Function *)local_2a8);
  std::__cxx11::string::~string((string *)&cond);
  std::__cxx11::string::~string((string *)&rwt);
  AixLog::Tag::~Tag((Tag *)&insts);
  local_358 = (undefined1  [8])((ulong)local_358 & 0xffffffffffffff00);
  AixLog::operator<<((ostream *)local_358,(Severity *)pTVar20);
  AixLog::Tag::Tag((Tag *)&rwt);
  AixLog::operator<<((ostream *)&rwt,pTVar20);
  new_phi._8_8_ = std::chrono::_V2::system_clock::now();
  new_phi.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001d8f28;
  AixLog::operator<<((ostream *)&new_phi,(Timestamp *)pTVar20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cond,"expand_loop",(allocator<char> *)local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_change_var,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
             ,(allocator<char> *)&extra_loop_start);
  pFVar21 = (Function *)&cond;
  AixLog::Function::Function((Function *)&insts,(string *)pFVar21,(string *)&new_change_var,0x140);
  AixLog::operator<<((ostream *)&insts,pFVar21);
  pTVar12 = (Tag *)std::operator<<((ostream *)&std::clog,"change : ");
  local_c0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_c0.id = (info->init_var).id;
  local_50._8_8_ = &PTR_display_001d90d0;
  local_38 = 1;
  local_50._0_8_ = &PTR_display_001dafa8;
  local_37._0_1_ = Lsl;
  local_37._1_1_ = '\0';
  local_70._8_4_ = (info->change).second;
  local_70._24_1_ = 0;
  local_70.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
  local_70.shift = Lsl;
  local_70.shift_amount = '\0';
  local_350._8_8_ = info;
  local_40 = local_c0.id;
  mir::inst::OpInst::OpInst
            ((OpInst *)local_2a8,&local_c0,(Value *)local_50,&local_70,(info->change).first);
  pTVar20 = pTVar12;
  (**(_func_int **)local_2a8._0_8_)();
  std::endl<char,std::char_traits<char>>((ostream *)pTVar12);
  AixLog::Function::~Function((Function *)&insts);
  std::__cxx11::string::~string((string *)&new_change_var);
  std::__cxx11::string::~string((string *)&cond);
  AixLog::Tag::~Tag((Tag *)&rwt);
  local_358 = (undefined1  [8])((ulong)local_358 & 0xffffffffffffff00);
  AixLog::operator<<((ostream *)local_358,(Severity *)pTVar20);
  AixLog::Tag::Tag((Tag *)&rwt);
  AixLog::operator<<((ostream *)&rwt,pTVar20);
  new_phi._8_8_ = std::chrono::_V2::system_clock::now();
  new_phi.super_Displayable._vptr_Displayable = (_func_int **)&PTR__Timestamp_001d8f28;
  AixLog::operator<<((ostream *)&new_phi,(Timestamp *)pTVar20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cond,"expand_loop",(allocator<char> *)local_350);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&new_change_var,
             "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
             ,(allocator<char> *)&extra_loop_start);
  pFVar21 = (Function *)&cond;
  AixLog::Function::Function((Function *)&insts,(string *)pFVar21,(string *)&new_change_var,0x144);
  AixLog::operator<<((ostream *)&insts,pFVar21);
  poVar11 = std::operator<<((ostream *)&std::clog,"continue when: ");
  uVar6 = local_350._8_8_;
  local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  local_d0.id = 0;
  local_80 = ((VarId *)(local_350._8_8_ + 0x10))->id;
  local_90._8_8_ = &PTR_display_001d90d0;
  local_78 = 1;
  local_90._0_8_ = &PTR_display_001dafa8;
  local_77._0_1_ = Lsl;
  local_77._1_1_ = '\0';
  local_a0 = (((pair<mir::inst::Op,_mir::inst::VarId> *)(local_350._8_8_ + 0x20))->second).id;
  local_b0._8_8_ = &PTR_display_001d90d0;
  local_98 = 1;
  local_b0._0_8_ = &PTR_display_001dafa8;
  local_97._0_1_ = Lsl;
  local_97._1_1_ = '\0';
  mir::inst::OpInst::OpInst
            ((OpInst *)local_2a8,&local_d0,(Value *)local_90,(Value *)local_b0,
             ((pair<mir::inst::Op,_mir::inst::VarId> *)(local_350._8_8_ + 0x20))->first);
  (**(_func_int **)local_2a8._0_8_)(local_2a8,poVar11);
  std::endl<char,std::char_traits<char>>(poVar11);
  AixLog::Function::~Function((Function *)&insts);
  std::__cxx11::string::~string((string *)&new_change_var);
  std::__cxx11::string::~string((string *)&cond);
  AixLog::Tag::~Tag((Tag *)&rwt);
  rwt.phi_var_pair.second.id = ((VarId *)(uVar6 + 0x10))->id;
  rwt.phi_var_pair.first.id = ((VarId *)(uVar6 + 0x40))->id;
  rwt.change_var.id = ((VarId *)(uVar6 + 0x50))->id;
  rwt.blk = local_338;
  rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_header;
  rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  rwt.phi_var_pair.first.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  rwt.phi_var_pair.second.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  rwt.change_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  rwt.func = func;
  rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       rwt.var_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar13 = std::_Rb_tree_decrement(&(func->variables)._M_t._M_impl.super__Rb_tree_header._M_header);
  rwt.varId = *(int *)(lVar13 + 0x20);
  pmVar14 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)local_2f8._8_8_,__k);
  loop_info::rewrite_jump_cond((loop_info *)uVar6,pmVar14);
  p_Var15 = (_Rb_tree_node_base *)
            std::_Rb_tree_decrement
                      (&(func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header);
  lVar13 = std::_Rb_tree_decrement(p_Var15);
  extra_loop_start = *(int *)(lVar13 + 0x20) + 1;
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_display_001db458;
  aStack_1e0._8_8_ = 0;
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aStack_1e0._M_allocated_capacity = 0;
  local_1c0._M_allocated_capacity = 0;
  local_1c0._8_8_ = 0;
  local_1b0 = (pointer)0x0;
  puStack_1a8 = (pointer)0x0;
  local_1a0 = &PTR_display_001db418;
  local_198 = Undefined;
  local_180 = false;
  local_178._0_4_ = -1;
  local_178._4_4_ = -1;
  local_170 = Undefined;
  extra_loop = *(int *)(lVar13 + 0x20) + 2;
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = extra_loop_start;
  local_1d0._M_p = (pointer)&aStack_1e0;
  local_1c8 = &aStack_1e0;
  local_2a8._0_4_ = extra_loop_start;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)(local_2a8 + 8),(BasicBlk *)&insts);
  this_02 = local_2f8._8_8_;
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_insert_unique<std::pair<int_const,mir::inst::BasicBlk>>
            ((_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
              *)local_2f8._8_8_,(pair<const_int,_mir::inst::BasicBlk> *)local_2a8);
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)(local_2a8 + 8));
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)&insts);
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_display_001db458;
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = extra_loop;
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aStack_1e0._M_allocated_capacity = 0;
  aStack_1e0._8_8_ = 0;
  local_1c0._M_allocated_capacity = 0;
  local_1c0._8_8_ = 0;
  local_1b0 = (pointer)0x0;
  puStack_1a8 = (pointer)0x0;
  local_308._M_p = (pointer)&PTR_display_001db418;
  local_1a0 = &PTR_display_001db418;
  local_198 = Undefined;
  local_180 = false;
  local_178._0_4_ = -1;
  local_178._4_4_ = -1;
  local_170 = Undefined;
  local_2a8._0_4_ = extra_loop;
  local_1d0._M_p = (pointer)&aStack_1e0;
  local_1c8 = &aStack_1e0;
  mir::inst::BasicBlk::BasicBlk((BasicBlk *)(local_2a8 + 8),(BasicBlk *)&insts);
  std::
  _Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
  ::_M_insert_unique<std::pair<int_const,mir::inst::BasicBlk>>
            ((_Rb_tree<int,std::pair<int_const,mir::inst::BasicBlk>,std::_Select1st<std::pair<int_const,mir::inst::BasicBlk>>,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
              *)this_02,(pair<const_int,_mir::inst::BasicBlk> *)local_2a8);
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)(local_2a8 + 8));
  mir::inst::BasicBlk::~BasicBlk((BasicBlk *)&insts);
  local_300 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)this_02,&extra_loop_start);
  pBVar7 = local_338;
  pmVar16 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)this_02,&extra_loop);
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(pBVar7->id,pmVar10->id);
  __l._M_len = 2;
  __l._M_array = (iterator)&insts;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2a8,__l,(less<int> *)&cond,
             (allocator_type *)&new_change_var);
  pmVar14 = local_300;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(local_300->preceding)._M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2a8);
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(pmVar16->id,pmVar14->id);
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&insts;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2a8,__l_00,(less<int> *)&cond,
             (allocator_type *)&new_change_var);
  uVar6 = local_350._8_8_;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(pmVar16->preceding)._M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2a8);
  insts.
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(pmVar16->id,pmVar14->id);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&insts;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_2a8,__l_01,(less<int> *)&cond,
             (allocator_type *)&new_change_var);
  local_2f8._M_allocated_capacity = (size_type)&(pmVar10->jump).bb_false;
  pmVar14 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)this_02,(key_type *)local_2f8._M_allocated_capacity);
  local_208 = (pair<mir::inst::Op,_mir::inst::VarId> *)(uVar6 + 0x20);
  local_210 = &((pair<mir::inst::Op,_mir::inst::VarId> *)(uVar6 + 0x20))->second;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::operator=
            (&(pmVar14->preceding)._M_t,
             (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2a8);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_2a8);
  this = &local_338->inst;
  puVar3 = (local_338->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (local_338->inst).
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pBVar7 = local_338, puVar18 != puVar3;
      puVar18 = puVar18 + 1) {
    local_2a8._0_4_ =
         (*(((puVar18->_M_t).
             super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
             super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
             super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
           _vptr_Displayable[6])();
    local_2a8._4_4_ = extraout_var;
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)&pmVar16->inst,
               (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2a8);
    if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_2a8._0_8_ !=
        (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
      (**(code **)(*(_func_int **)local_2a8._0_8_ + 0x28))();
    }
  }
  local_280 = pmVar16->id;
  local_27c = *(int *)local_2f8._M_allocated_capacity;
  local_290._M_local_buf[8] =
       (local_338->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
       .super__Optional_payload_base<mir::inst::VarId>._M_engaged != false;
  if ((bool)local_290._M_local_buf[8]) {
    local_290._M_allocated_capacity._0_4_ =
         (local_338->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>.
         _M_payload.super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id;
    local_2a8._16_8_ = &PTR_display_001d90d0;
  }
  local_2a8._8_4_ = 2;
  local_2a8._0_8_ = local_308._M_p;
  local_278 = Loop;
  mir::inst::JumpInstruction::operator=(&pmVar16->jump,(JumpInstruction *)local_2a8);
  loop_info::rewrite_jump_cond((loop_info *)local_350._8_8_,pBVar7);
  uVar6 = local_350._8_8_;
  new_change_var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
  new_change_var.id = 0xffffffff;
  Rewriter::get_insts(&insts,&rwt,*(int *)local_350._8_8_,&new_change_var);
  loop_info::copy_var((loop_info *)&new_phi,(VarId *)uVar6);
  local_2a8._0_8_ = &PTR_display_001d90d0;
  local_2a8._8_4_ = ((VarId *)(uVar6 + 0x10))->id;
  local_2a8._16_8_ = &PTR_display_001d90d0;
  local_290._M_allocated_capacity._0_4_ = new_change_var.id;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_2a8;
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&cond,__l_02,&local_339)
  ;
  std::
  make_unique<mir::inst::PhiInst,mir::inst::VarId&,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>
            ((VarId *)local_350,
             (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&new_phi);
  local_358 = (undefined1  [8])local_350._0_8_;
  local_350._0_8_ =
       (__uniq_ptr_impl<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>)0x0;
  this_00 = &local_300->inst;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)this_00,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_358);
  this_01 = &(local_338->jump).cond_or_ret;
  if ((_Head_base<0UL,_mir::inst::Inst_*,_false>)local_358 !=
      (_Head_base<0UL,_mir::inst::Inst_*,_false>)0x0) {
    (*((Displayable *)local_358)->_vptr_Displayable[5])();
  }
  local_358 = (undefined1  [8])0x0;
  std::unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>::~unique_ptr
            ((unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)local_350);
  std::_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Vector_base
            ((_Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)&cond);
  std::optional<mir::inst::VarId>::value(this_01);
  loop_info::copy_var((loop_info *)&cond,(VarId *)local_350._8_8_);
  std::
  make_unique<mir::inst::OpInst,mir::inst::VarId&,mir::inst::VarId&,mir::inst::VarId&,mir::inst::Op&>
            ((VarId *)local_358,&cond,&new_phi,(Op *)local_210);
  local_2a8._0_8_ = local_358;
  local_358 = (undefined1  [8])0x0;
  local_350._8_8_ = this_01;
  std::
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
            ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)this_00,
             (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)local_2a8);
  pBVar7 = local_338;
  if ((__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)local_2a8._0_8_ !=
      (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0) {
    (**(code **)(*(_func_int **)local_2a8._0_8_ + 0x28))();
  }
  local_2a8._0_8_ = (__uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>)0x0;
  std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::~unique_ptr
            ((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)local_358);
  pmVar14 = local_300;
  _Var8._M_p = local_308._M_p;
  local_280 = pmVar16->id;
  local_27c = *(int *)local_2f8._M_allocated_capacity;
  local_2a8._0_8_ = local_308._M_p;
  local_2a8._8_4_ = 2;
  local_2a8._16_8_ = &PTR_display_001d90d0;
  local_290._M_allocated_capacity._0_4_ = cond.id;
  local_290._M_local_buf[8] = '\x01';
  local_278 = local_2a8._8_4_;
  mir::inst::JumpInstruction::operator=(&local_300->jump,(JumpInstruction *)local_2a8);
  LVar1 = pBVar7->id;
  LVar2 = pmVar14->id;
  pVVar17 = std::optional<mir::inst::VarId>::value((optional<mir::inst::VarId> *)local_350._8_8_);
  local_290._M_allocated_capacity._0_4_ = pVVar17->id;
  local_2a8._0_8_ = _Var8._M_p;
  local_2a8._8_4_ = 2;
  local_2a8._16_8_ = &PTR_display_001d90d0;
  local_290._M_local_buf[8] = '\x01';
  local_280 = LVar1;
  local_27c = LVar2;
  local_278 = local_2a8._8_4_;
  mir::inst::JumpInstruction::operator=(&pBVar7->jump,(JumpInstruction *)local_2a8);
  tVar4.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl =
       *(_Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_> *)
        &(((pmVar16->inst).
           super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>;
  iVar9 = (**(code **)(*(long *)tVar4.
                                super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                                .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl + 8))
                    (tVar4.
                     super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                     .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl);
  uVar6 = local_2f8._8_8_;
  if (iVar9 != 7) {
    __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                  "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                  ,0x180,
                  "void optimization::loop_unrolling::expand_loop(mir::inst::MirFunction &, mir::inst::BasicBlk &, loop_info)"
                 );
  }
  _Var22._M_head_impl = (Inst *)0x0;
  if (*(undefined ***)
       tVar4.super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
       super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl == &PTR_display_001db3b8) {
    _Var22._M_head_impl =
         (Inst *)tVar4.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
  }
  __position = std::
               __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                         (*(long *)((long)_Var22._M_head_impl + 0x28),
                          *(long *)((long)_Var22._M_head_impl + 0x30),local_200);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             ((long)_Var22._M_head_impl + 0x28),(const_iterator)__position._M_current);
  std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
            ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
             ((long)_Var22._M_head_impl + 0x28),&new_phi);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::clear(this);
  puVar5 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
           CONCAT44(insts.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                    (uint32_t)
                    insts.
                    super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
  for (puVar18 = insts.
                 super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar5; puVar18 = puVar18 + 1
      ) {
    std::
    vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
    ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
              ((vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
                *)this,puVar18);
  }
  pmVar14 = std::
            map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
            ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                  *)uVar6,(key_type *)local_2f8._M_allocated_capacity);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::erase
            (&(pmVar14->preceding)._M_t,&(pmVar10->jump).bb_true);
  iVar9 = (pmVar10->jump).bb_true;
  LVar1 = local_300->id;
  pVVar17 = std::optional<mir::inst::VarId>::value(&(pmVar10->jump).cond_or_ret);
  local_290._M_allocated_capacity._0_4_ = pVVar17->id;
  local_2a8._0_8_ = local_308._M_p;
  local_2a8._8_4_ = 2;
  local_2a8._16_8_ = &PTR_display_001d90d0;
  local_290._M_local_buf[8] = '\x01';
  local_278 = Undefined;
  local_280 = iVar9;
  local_27c = LVar1;
  mir::inst::JumpInstruction::operator=(&pmVar10->jump,(JumpInstruction *)local_2a8);
  std::
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  ::~vector(&insts);
  std::
  _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~_Rb_tree(&rwt.var_map._M_t);
  return;
}

Assistant:

void expand_loop(mir::inst::MirFunction& func, mir::inst::BasicBlk& blk,
                 loop_info info) {
  auto& loop_start = func.basic_blks.at(info.loop_start);
  LOG(TRACE) << "unroll loop starts at  " << info.loop_start << std::endl;
  LOG(TRACE) << "init_val: " << info.init_var << std::endl;
  LOG(TRACE) << "change : "
             << mir::inst::OpInst(info.init_var, info.init_var,
                                  info.change.second, info.change.first)
             << std::endl;
  LOG(TRACE) << "continue when: "
             << mir::inst::OpInst(mir::inst::VarId(0), info.init_var,
                                  info.cmp.second, info.cmp.first)
             << std::endl;
  Rewriter rwt(func, blk, {info.phi_var, info.init_var}, info.change_var);
  info.rewrite_jump_cond(func.basic_blks.at(info.loop_start));

  auto end_iter = func.basic_blks.end();
  end_iter--;
  end_iter--;

  // extra loop
  auto extra_loop_start = end_iter->first + 1;
  auto extra_loop = end_iter->first + 2;
  func.basic_blks.insert(
      {extra_loop_start, mir::inst::BasicBlk(extra_loop_start)});
  func.basic_blks.insert({extra_loop, mir::inst::BasicBlk(extra_loop)});
  auto& extra_loop_start_blk = func.basic_blks.at(extra_loop_start);
  auto& extra_loop_blk = func.basic_blks.at(extra_loop);
  extra_loop_start_blk.preceding =
      std::set<mir::types::LabelId>{loop_start.id, blk.id};
  extra_loop_blk.preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // original loop's end
  func.basic_blks.at(loop_start.jump.bb_false).preceding =
      std::set<mir::types::LabelId>{extra_loop_start_blk.id, extra_loop_blk.id};

  // copy original loop insts in extra loop blk
  for (auto& inst : blk.inst) {
    extra_loop_blk.inst.push_back(
        std::unique_ptr<mir::inst::Inst>(inst->deep_copy()));
  }
  extra_loop_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, blk.jump.cond_or_ret,
      mir::inst::JumpKind::Loop);

  // after copy then can be rewrrote
  info.rewrite_jump_cond(blk);

  // init extra loop start 's insts
  int times = info.get_times();
  mir::inst::VarId new_change_var;
  auto insts = rwt.get_insts(times, new_change_var);
  auto new_phi = info.copy_var(info.init_var);
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
      new_phi, std::vector<mir::inst::VarId>{info.init_var, new_change_var}));
  auto cond = info.copy_var(blk.jump.cond_or_ret.value());
  extra_loop_start_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
      cond, new_phi, info.cmp.second, info.cmp.first));
  extra_loop_start_blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, extra_loop_blk.id,
      loop_start.jump.bb_false, cond, mir::inst::JumpKind::Loop);

  blk.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, blk.id, extra_loop_start_blk.id,
      blk.jump.cond_or_ret.value(), mir::inst::JumpKind::Loop);
  auto& inst = extra_loop_blk.inst.front();
  auto& i = *inst;
  assert(inst->inst_kind() == mir::inst::InstKind::Phi);
  auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  phiInst->vars.erase(
      std::find(phiInst->vars.begin(), phiInst->vars.end(), info.init_var));
  phiInst->vars.push_back(new_phi);
  blk.inst.clear();
  for (auto& inst : insts) {
    blk.inst.push_back(std::move(inst));
  }
  func.basic_blks.at(loop_start.jump.bb_false)
      .preceding.erase(loop_start.jump.bb_true);

  loop_start.jump = mir::inst::JumpInstruction(
      mir::inst::JumpInstructionKind::BrCond, loop_start.jump.bb_true,
      extra_loop_start_blk.id, loop_start.jump.cond_or_ret.value());
  // auto& end_loop_blk = func.basic_blks.at(loop_start.jump.bb_true);
  // for (auto iter = end_loop_blk.inst.begin();
  //      iter != end_loop_blk.inst.end() &&
  //      iter->get()->inst_kind() == mir::inst::InstKind::Phi;
  //      iter++) {
  //   auto& inst = *iter;
  //   auto& i = *inst;
  //   auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
  //   if (phiInst->useVars().count(info.change_var)) {
  //     phiInst->vars.erase(std::find(phiInst->vars.begin(),
  //     phiInst->vars.end(),
  //                                   info.change_var));
  //   }
  //   if (times) {
  //     if (phiInst->useVars().count(info.init_var)) {
  //       phiInst->vars.erase(std::find(
  //           phiInst->vars.begin(), phiInst->vars.end(),
  //           info.init_var));
  //       phiInst->vars.push_back(new_change_var);
  //     }
  //   }
  // }
}